

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  Parameters params;
  
  params.filter._M_dataplus._M_p = (pointer)&params.filter.field_2;
  params.filter._M_string_length = 0;
  params.filter.field_2._M_local_buf[0] = '\0';
  bVar1 = parse_args(argc,argv,&params);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2,"[input-size [iterations-count [function-filter]]]");
    std::operator<<(poVar2,'\n');
  }
  else {
    flag_test(&params);
  }
  std::__cxx11::string::~string((string *)&params.filter);
  return (uint)!bVar1;
}

Assistant:

int main(int argc, char **argv) {
    Parameters params;

    if (!parse_args(argc, argv, params)) {
        std::cout << "Usage: " << argv[0] << "[input-size [iterations-count [function-filter]]]" << '\n';
        return EXIT_FAILURE;
    }

    flag_test(params);
    return EXIT_SUCCESS;
}